

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTShapeProfileDef::~IfcTShapeProfileDef(IfcTShapeProfileDef *this)

{
  undefined1 *puVar1;
  bool *pbVar2;
  
  *(undefined8 *)&this[-1].FilletRadius.have = 0x871fc0;
  this->WebThickness = 4.37521216058524e-317;
  puVar1 = *(undefined1 **)&this[-1].WebSlope.have;
  pbVar2 = &this[-1].FlangeSlope.have;
  if ((bool *)puVar1 != pbVar2) {
    operator_delete(puVar1,*(long *)pbVar2 + 1);
  }
  puVar1 = *(undefined1 **)&this[-1].FlangeEdgeRadius.have;
  pbVar2 = &this[-1].WebEdgeRadius.have;
  if ((bool *)puVar1 != pbVar2) {
    operator_delete(puVar1,*(long *)pbVar2 + 1);
  }
  operator_delete(&this[-1].FilletRadius.have,0x118);
  return;
}

Assistant:

IfcTShapeProfileDef() : Object("IfcTShapeProfileDef") {}